

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void getQR(double *A,int M,int N,double *bvec,double *Q,double *R)

{
  size_t __size;
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  double *B;
  double *A_00;
  double *C;
  ulong uVar5;
  double *pdVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  double *pdVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  double *local_88;
  double *local_80;
  long local_40;
  
  lVar15 = (long)M;
  __size = lVar15 * 8;
  B = (double *)malloc(__size);
  lVar17 = (long)N;
  A_00 = (double *)malloc(__size * lVar17);
  C = (double *)malloc(__size * lVar15);
  uVar5 = (ulong)(uint)N;
  if (0 < N) {
    uVar8 = 0;
    pdVar12 = A;
    do {
      uVar11 = 0;
      do {
        if (uVar11 < uVar8) {
          R[uVar11] = 0.0;
        }
        else {
          R[uVar11] = pdVar12[uVar11];
        }
        uVar11 = uVar11 + 1;
      } while (uVar5 != uVar11);
      uVar8 = uVar8 + 1;
      R = R + uVar5;
      pdVar12 = pdVar12 + uVar5;
    } while (uVar8 != uVar5);
  }
  if (0 < M) {
    uVar8 = 0;
    uVar11 = 0;
    do {
      if (0 < N) {
        uVar14 = 0;
        do {
          if (uVar11 == uVar14) {
            Q[uVar11 + (uint)((int)uVar11 * N)] = 1.0;
          }
          else {
            Q[uVar8 + uVar14] = 0.0;
          }
          uVar14 = uVar14 + 1;
        } while (uVar5 != uVar14);
      }
      uVar11 = uVar11 + 1;
      uVar8 = (ulong)(uint)((int)uVar8 + N);
    } while (uVar11 != (uint)M);
  }
  if (0 < N) {
    iVar18 = M - N;
    pdVar12 = (double *)((long)A + (lVar17 * 8 + 8) * lVar17 + -8);
    uVar5 = lVar17 * 8 ^ 0xfffffffffffffff8;
    local_88 = Q + lVar17 * lVar17;
    local_80 = Q + lVar17 * lVar17 + -1;
    iVar3 = 1;
    lVar16 = 0;
    local_40 = lVar17;
    do {
      iVar18 = iVar18 + 1;
      *B = 1.0;
      if (local_40 < lVar15) {
        lVar7 = 0;
        pdVar6 = pdVar12;
        do {
          B[lVar7 + 1] = *pdVar6;
          pdVar6 = pdVar6 + lVar17;
          lVar9 = local_40 + lVar7;
          lVar7 = lVar7 + 1;
        } while (lVar9 + 1 < lVar15);
      }
      lVar7 = local_40 + -1;
      if (local_40 <= lVar15) {
        iVar4 = 0;
        pdVar6 = local_88;
        lVar9 = lVar7;
        do {
          if (local_40 <= lVar17) {
            lVar13 = -1;
            iVar10 = iVar4;
            do {
              A_00[iVar10] = pdVar6[lVar13];
              iVar10 = iVar10 + iVar18;
              lVar13 = lVar13 + 1;
            } while (lVar16 != lVar13);
          }
          lVar9 = lVar9 + 1;
          iVar4 = iVar4 + 1;
          pdVar6 = pdVar6 + lVar17;
        } while (lVar9 != lVar15);
      }
      iVar4 = N - (int)lVar7;
      iVar10 = M - (int)lVar7;
      mmult(A_00,B,C,iVar4,iVar10,1);
      dVar1 = bvec[lVar7];
      lVar9 = -1;
      do {
        C[lVar9 + 1] = C[lVar9 + 1] * dVar1;
        lVar9 = lVar9 + 1;
      } while (lVar16 != lVar9);
      mmult(B,C,A_00,iVar10,1,iVar4);
      if (local_40 <= lVar15) {
        iVar4 = 0;
        pdVar6 = local_80;
        lVar9 = lVar7;
        do {
          if (local_40 <= lVar17) {
            lVar13 = 0;
            do {
              pdVar6[lVar13] = pdVar6[lVar13] - A_00[iVar4 + (int)lVar13];
              lVar13 = lVar13 + 1;
            } while (lVar16 + 1 != lVar13);
          }
          lVar9 = lVar9 + 1;
          pdVar6 = pdVar6 + lVar17;
          iVar4 = iVar4 + iVar3;
        } while (lVar9 != lVar15);
      }
      pdVar12 = (double *)((long)pdVar12 + uVar5);
      local_88 = (double *)((long)local_88 + uVar5);
      lVar16 = lVar16 + 1;
      local_80 = (double *)((long)local_80 + uVar5);
      iVar3 = iVar3 + 1;
      bVar2 = 1 < local_40;
      local_40 = lVar7;
    } while (bVar2);
  }
  free(B);
  free(A_00);
  free(C);
  return;
}

Assistant:

void getQR(double *A,int M,int N,double *bvec,double *Q, double *R) {
	int i,j,k,t,u;
	double *x,*v,*AT,*w;
	
	x = (double*) malloc(sizeof(double) * M);
	v = (double*) malloc(sizeof(double) * M);
	AT = (double*) malloc(sizeof(double) * M * N);
	w = (double*) malloc(sizeof(double) * M * M);
	
	for(i = 0; i < N;++i) {
		t = i *N;
		for(j = 0; j < N;++j) {
			if (i > j) {
				R[t+j] = 0.;
			} else {
				R[t+j] = A[t+j];
			}
		}
	}
	
	for(i = 0; i < M;++i) {
		t = i *N;
		for(j = 0; j < N;++j) {
			if (i == j) {
				Q[t+j] = 1.;
			} else {
				Q[t+j] = 0.;
			}
		}
	}
	
	for(j = N-1; j >= 0;--j) {
		v[0] = 1.;
		for(i=j+1;i < M;++i) {
			v[i-j] = A[i*N+j];
			
		}
		
		for (i=j; i < M; i++) {
			t = i * N;
			u = 0;
			for (k=j; k < N; k++) {
				AT[u+i-j] = Q[k+t];
				u+=(M-j);
			}
			
		}
	
		mmult(AT,v,w,N-j,M-j,1);
		scale(w,N-j,1,bvec[j]);
		mmult(v,w,AT,M-j,1,N-j);
		
		for (i=j; i < M; i++) {
			t = i *N;
			for (k=j; k < N; k++) {
				Q[t+k] -= AT[(i-j)*(N-j) + k - j];
			}
		}
	 
	}
	
	free(x);
	free(v);
	free(AT);
	free(w);
}